

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void __thiscall
TorController::TorController
          (TorController *this,event_base *_base,string *tor_control_center,CService *target)

{
  string *tor_control_center_00;
  long lVar1;
  bool bVar2;
  event *peVar3;
  char *this_00;
  TorController *this_01;
  path *this_02;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>
  local_c0;
  string local_a8;
  undefined1 local_88 [40];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pkf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->base = _base;
  tor_control_center_00 = &this->m_tor_control_center;
  std::__cxx11::string::string((string *)tor_control_center_00,tor_control_center);
  TorControlConnection::TorControlConnection(&this->conn,this->base);
  (this->private_key)._M_dataplus._M_p = (pointer)&(this->private_key).field_2;
  (this->private_key)._M_string_length = 0;
  (this->private_key).field_2._M_local_buf[0] = '\0';
  (this->service_id)._M_dataplus._M_p = (pointer)&(this->service_id).field_2;
  (this->service_id)._M_string_length = 0;
  (this->service_id).field_2._M_local_buf[0] = '\0';
  this->reconnect = true;
  this->reconnect_ev = (event *)0x0;
  this->reconnect_timeout = 1.0;
  CService::CService(&this->service);
  CService::CService(&this->m_target,target);
  (this->clientNonce).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clientNonce).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cookie).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->clientNonce).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cookie).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cookie).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  peVar3 = (event *)event_new(this->base,0xffffffffffffffff,0,reconnect_cb,this);
  this->reconnect_ev = peVar3;
  if (peVar3 == (event *)0x0) {
    logging_function._M_str = "TorController";
    logging_function._M_len = 0xd;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file._M_len = 0x57;
    ::LogPrintf_<>(logging_function,source_file,0x148,ALL,Info,
                   "tor: Failed to create event for reconnection: out of memory?\n");
  }
  local_a8._M_dataplus._M_p = (pointer)connected_cb;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_allocated_capacity = (size_type)this;
  std::function<void(TorControlConnection&)>::
  function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>))(TorControlConnection&)>,void>
            ((function<void(TorControlConnection&)> *)&pkf,
             (_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>
              *)&local_a8);
  local_c0._M_f = (offset_in_TorController_to_subr)disconnected_cb;
  local_c0._8_8_ = 0;
  local_c0._M_bound_args.super__Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_TorController_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>_>)this;
  std::function<void(TorControlConnection&)>::
  function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>))(TorControlConnection&)>,void>
            ((function<void(TorControlConnection&)> *)local_88,&local_c0);
  this_00 = (char *)tor_control_center_00;
  bVar2 = TorControlConnection::Connect
                    (&this->conn,tor_control_center_00,(ConnectionCB *)&pkf,(ConnectionCB *)local_88
                    );
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)&pkf);
  if (!bVar2) {
    logging_function_00._M_str = "TorController";
    logging_function_00._M_len = 0xd;
    this_00 = "TorController";
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_00._M_len = 0x57;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_00,0x14c,ALL,Info,
               "tor: Initiating connection to Tor control port %s failed\n",tor_control_center_00);
  }
  GetPrivateKeyFile((path *)local_88,(TorController *)this_00);
  this_01 = (TorController *)local_88;
  ReadBinaryFile_abi_cxx11_(&pkf,(path *)this_01,0xffffffffffffffff);
  this_02 = (path *)local_88;
  std::filesystem::__cxx11::path::~path(this_02);
  if (pkf.first == true) {
    bVar2 = ::LogAcceptCategory((LogFlags)this_02,(Level)this_01);
    if (bVar2) {
      GetPrivateKeyFile((path *)local_88,this_01);
      std::filesystem::__cxx11::path::string(&local_a8,(path *)local_88);
      logging_function_01._M_str = "TorController";
      logging_function_01._M_len = 0xd;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_01._M_len = 0x57;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_01,source_file_01,0x151,TOR,Debug,
                 "Reading cached private key from %s\n",&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::filesystem::__cxx11::path::~path((path *)local_88);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->private_key,&pkf.second);
  }
  std::__cxx11::string::~string((string *)&pkf.second);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TorController::TorController(struct event_base* _base, const std::string& tor_control_center, const CService& target):
    base(_base),
    m_tor_control_center(tor_control_center), conn(base), reconnect(true), reconnect_timeout(RECONNECT_TIMEOUT_START),
    m_target(target)
{
    reconnect_ev = event_new(base, -1, 0, reconnect_cb, this);
    if (!reconnect_ev)
        LogPrintf("tor: Failed to create event for reconnection: out of memory?\n");
    // Start connection attempts immediately
    if (!conn.Connect(m_tor_control_center, std::bind(&TorController::connected_cb, this, std::placeholders::_1),
         std::bind(&TorController::disconnected_cb, this, std::placeholders::_1) )) {
        LogPrintf("tor: Initiating connection to Tor control port %s failed\n", m_tor_control_center);
    }
    // Read service private key if cached
    std::pair<bool,std::string> pkf = ReadBinaryFile(GetPrivateKeyFile());
    if (pkf.first) {
        LogDebug(BCLog::TOR, "Reading cached private key from %s\n", fs::PathToString(GetPrivateKeyFile()));
        private_key = pkf.second;
    }
}